

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

ByteArray *
ot::commissioner::CommissionerImpl::GetCommissionerDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  uchar local_20 [8];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((aDatasetFlags >> 0xe & 1) != 0) {
    local_20[7] = 0xb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20 + 7);
  }
  if ((short)aDatasetFlags < 0) {
    local_20[6] = 9;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20 + 6);
  }
  if ((aDatasetFlags >> 0xd & 1) != 0) {
    local_20[5] = 8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20 + 5);
  }
  if ((aDatasetFlags >> 0xc & 1) != 0) {
    local_20[4] = 0x3d;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20 + 4);
  }
  if ((aDatasetFlags >> 0xb & 1) != 0) {
    local_20[3] = 0x3e;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20 + 3);
  }
  if ((aDatasetFlags >> 10 & 1) != 0) {
    local_20[2] = 0x12;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20 + 2);
  }
  if ((aDatasetFlags >> 9 & 1) != 0) {
    local_20[1] = 0x41;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20 + 1);
  }
  if ((aDatasetFlags >> 8 & 1) != 0) {
    local_20[0] = 'B';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetCommissionerDatasetTlvs(uint16_t aDatasetFlags)
{
    ByteArray tlvTypes;

    if (aDatasetFlags & CommissionerDataset::kSessionIdBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kCommissionerSessionId));
    }

    if (aDatasetFlags & CommissionerDataset::kBorderAgentLocatorBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kBorderAgentLocator));
    }

    if (aDatasetFlags & CommissionerDataset::kSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kAeSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kAeSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kNmkpSteeringDataBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kNmkpSteeringData));
    }

    if (aDatasetFlags & CommissionerDataset::kJoinerUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kJoinerUdpPort));
    }

    if (aDatasetFlags & CommissionerDataset::kAeUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kAeUdpPort));
    }

    if (aDatasetFlags & CommissionerDataset::kNmkpUdpPortBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kNmkpUdpPort));
    }
    return tlvTypes;
}